

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::TYA(CPU *this)

{
  CPU *this_local;
  
  this->A = this->Y;
  if (this->A == '\0') {
    this->field_0x2e = this->field_0x2e & 0xbf | 0x40;
  }
  else {
    this->field_0x2e = this->field_0x2e & 0xbf;
  }
  if ((this->A & 0x80) == 0) {
    this->field_0x2e = this->field_0x2e & 0xfe;
  }
  else {
    this->field_0x2e = this->field_0x2e & 0xfe | 1;
  }
  return;
}

Assistant:

void CPU::TYA() {
	A = Y;
	if (A == 0) {
		Z = 1;
	} else {
		Z = 0;
	}
	if (A & (1 << 7)) {
		N = 1;
	} else {
		N = 0;
	}
}